

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.cpp
# Opt level: O2

vector<record,_std::allocator<record>_> * __thiscall
page::getRecords(vector<record,_std::allocator<record>_> *__return_storage_ptr__,page *this,
                fstream *stream,int offset,uint8_t numFields)

{
  ulong uVar1;
  int iVar2;
  record record;
  record local_48;
  
  std::vector<record,_std::allocator<record>_>::vector
            (__return_storage_ptr__,(ulong)this->numRecords,(allocator_type *)&local_48);
  uVar1 = 0;
  iVar2 = 0;
  while ((uVar1 < this->slotSize && (iVar2 < (int)(uint)this->numRecords))) {
    if (this->slots[uVar1] != '\0') {
      ::record::record(&local_48,'\0',numFields);
      ::record::read(&local_48,(int)stream,
                     (void *)(ulong)((this->slots[uVar1] - 1) * this->recordSize +
                                    (uint)this->slotSize + offset + 2),(size_t)this->slots);
      ::record::operator=((__return_storage_ptr__->
                          super__Vector_base<record,_std::allocator<record>_>)._M_impl.
                          super__Vector_impl_data._M_start + iVar2,&local_48);
      iVar2 = iVar2 + 1;
      ::record::~record(&local_48);
    }
    uVar1 = uVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<record> page::getRecords(std::fstream &stream, int offset, uint8_t numFields) {

    auto records = std::vector<record>(this->numRecords);
    int k = 0;
    for (int i = 0; i < this->slotSize && k < this->numRecords; ++i) {
        if(this->slots[i] == 0) { continue; }
        record record(0, numFields);
        record.read(stream, offset + PAGE_ID + PAGE_NUM_RECORDS + this->slotSize + (this->slots[i] - 1) * this->recordSize);
        records[k] = record;
        k++;
    }

    return records;
}